

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall DyndepParserTestOutNoRule::Run(DyndepParserTestOutNoRule *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  string err;
  DyndepParser parser;
  char kInput [36];
  DyndepParserTestOutNoRule *this_local;
  
  parser.env_.parent_ = (BindingEnv *)0x79645f616a6e696e;
  DyndepParser::DyndepParser
            ((DyndepParser *)((long)&err.field_2 + 8),&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  std::__cxx11::string::string((string *)local_118);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,(char *)&parser.env_.parent_,&local_139);
  bVar2 = DyndepParser::ParseTest
                    ((DyndepParser *)((long)&err.field_2 + 8),&local_138,(string *)local_118);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x10a,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:2: expected build command name \'dyndep\'\nbuild out:\n          ^ near here"
                          ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_118);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x10d,
             "\"input:2: expected build command name \'dyndep\'\\n\" \"build out:\\n\" \"          ^ near here\" == err"
            );
  std::__cxx11::string::~string((string *)local_118);
  DyndepParser::~DyndepParser((DyndepParser *)((long)&err.field_2 + 8));
  return;
}

Assistant:

TEST_F(DyndepParserTest, OutNoRule) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out:";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:2: expected build command name 'dyndep'\n"
            "build out:\n"
            "          ^ near here", err);
}